

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::anon_unknown_0::safe_parse_negative_int<int>
          (anon_unknown_0 *this,string_view text,int base,Nonnull<int_*> value_p)

{
  int iVar1;
  size_type sVar2;
  const_pointer pvVar3;
  const_reference pvVar4;
  undefined4 in_register_0000000c;
  int *piVar5;
  int iVar6;
  bool bVar7;
  int digit;
  uchar c;
  char *end;
  char *start;
  int vmin_over_base;
  int vmin;
  int value;
  Nonnull<int_*> value_p_local;
  undefined1 auStack_20 [4];
  int base_local;
  string_view text_local;
  
  piVar5 = (int *)CONCAT44(in_register_0000000c,base);
  text_local._M_len = text._M_len;
  iVar6 = (int)text._M_str;
  vmin_over_base = 0;
  _auStack_20 = this;
  if (-iVar6 != -0x80000000 && SBORROW4(-0x80000000,-iVar6) == iVar6 + -0x80000000 < 0) {
    __assert_fail("vmin <= 0 - base",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x400,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = int]"
                 );
  }
  start._4_4_ = *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase + (long)iVar6 * 4);
  bVar7 = true;
  if (1 < iVar6) {
    iVar1 = std::numeric_limits<int>::min();
    bVar7 = iVar1 / iVar6 == start._4_4_;
  }
  if (!bVar7) {
    __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x403,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = int]"
                 );
  }
  if (0 < -0x80000000 % iVar6) {
    start._4_4_ = start._4_4_ + 1;
  }
  end = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar3 = end + sVar2;
  while( true ) {
    if (pvVar3 <= end) {
      *piVar5 = vmin_over_base;
      return true;
    }
    pvVar4 = std::array<signed_char,_256UL>::operator[]
                       ((array<signed_char,_256UL> *)(anonymous_namespace)::kAsciiToInt,
                        (ulong)(byte)*end);
    iVar1 = (int)*pvVar4;
    if (iVar6 <= iVar1) {
      *piVar5 = vmin_over_base;
      return false;
    }
    if (vmin_over_base < start._4_4_) {
      *piVar5 = -0x80000000;
      return false;
    }
    if (iVar6 * vmin_over_base < iVar1 + -0x80000000) break;
    vmin_over_base = iVar6 * vmin_over_base - iVar1;
    end = end + 1;
  }
  *piVar5 = -0x80000000;
  return false;
}

Assistant:

inline bool safe_parse_negative_int(absl::string_view text, int base,
                                    absl::Nonnull<IntType*> value_p) {
  IntType value = 0;
  const IntType vmin = std::numeric_limits<IntType>::min();
  assert(vmin < 0);
  assert(vmin <= 0 - base);
  IntType vmin_over_base = LookupTables<IntType>::kVminOverBase[base];
  assert(base < 2 ||
         std::numeric_limits<IntType>::min() / base == vmin_over_base);
  // 2003 c++ standard [expr.mul]
  // "... the sign of the remainder is implementation-defined."
  // Although (vmin/base)*base + vmin%base is always vmin.
  // 2011 c++ standard tightens the spec but we cannot rely on it.
  // TODO(junyer): Handle this in the lookup table generation.
  if (vmin % base > 0) {
    vmin_over_base += 1;
  }
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = kAsciiToInt[c];
    if (digit >= base) {
      *value_p = value;
      return false;
    }
    if (value < vmin_over_base) {
      *value_p = vmin;
      return false;
    }
    value *= base;
    if (value < vmin + digit) {
      *value_p = vmin;
      return false;
    }
    value -= digit;
  }
  *value_p = value;
  return true;
}